

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPRequest.hpp
# Opt level: O0

void __thiscall http::Request::Request(Request *this,string *url,InternetProtocol protocol)

{
  char cVar1;
  string local_f0 [32];
  long local_d0;
  size_type portPosition;
  string local_a8 [32];
  long local_88;
  size_type pathPosition;
  size_type fragmentPosition;
  string local_48 [32];
  long local_28;
  size_type schemeEndPosition;
  string *psStack_18;
  InternetProtocol protocol_local;
  string *url_local;
  Request *this_local;
  
  this->internetProtocol = protocol;
  schemeEndPosition._7_1_ = protocol;
  psStack_18 = url;
  url_local = (string *)this;
  std::__cxx11::string::string((string *)&this->scheme);
  std::__cxx11::string::string((string *)&this->domain);
  std::__cxx11::string::string((string *)&this->port);
  std::__cxx11::string::string((string *)&this->path);
  local_28 = std::__cxx11::string::find((char *)psStack_18,0x1ab831);
  if (local_28 == -1) {
    std::__cxx11::string::operator=((string *)&this->scheme,"http");
    std::__cxx11::string::operator=((string *)&this->path,(string *)psStack_18);
  }
  else {
    std::__cxx11::string::substr((ulong)local_48,(ulong)psStack_18);
    std::__cxx11::string::operator=((string *)&this->scheme,local_48);
    std::__cxx11::string::~string(local_48);
    std::__cxx11::string::substr((ulong)&fragmentPosition,(ulong)psStack_18);
    std::__cxx11::string::operator=((string *)&this->path,(string *)&fragmentPosition);
    std::__cxx11::string::~string((string *)&fragmentPosition);
  }
  cVar1 = (char)this;
  pathPosition = std::__cxx11::string::find(cVar1 + 'h',0x23);
  if (pathPosition != 0xffffffffffffffff) {
    std::__cxx11::string::resize((ulong)&this->path);
  }
  local_88 = std::__cxx11::string::find(cVar1 + 'h',0x2f);
  if (local_88 == -1) {
    std::__cxx11::string::operator=((string *)&this->domain,(string *)&this->path);
    std::__cxx11::string::operator=((string *)&this->path,"/");
  }
  else {
    std::__cxx11::string::substr((ulong)local_a8,(ulong)&this->path);
    std::__cxx11::string::operator=((string *)&this->domain,local_a8);
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::substr((ulong)&portPosition,(ulong)&this->path);
    std::__cxx11::string::operator=((string *)&this->path,(string *)&portPosition);
    std::__cxx11::string::~string((string *)&portPosition);
  }
  local_d0 = std::__cxx11::string::find(cVar1 + '(',0x3a);
  if (local_d0 == -1) {
    std::__cxx11::string::operator=((string *)&this->port,"80");
  }
  else {
    std::__cxx11::string::substr((ulong)local_f0,(ulong)&this->domain);
    std::__cxx11::string::operator=((string *)&this->port,local_f0);
    std::__cxx11::string::~string(local_f0);
    std::__cxx11::string::resize((ulong)&this->domain);
  }
  return;
}

Assistant:

explicit Request(const std::string& url,
                         InternetProtocol protocol = InternetProtocol::V4):
            internetProtocol(protocol)
        {
            const auto schemeEndPosition = url.find("://");

            if (schemeEndPosition != std::string::npos)
            {
                scheme = url.substr(0, schemeEndPosition);
                path = url.substr(schemeEndPosition + 3);
            }
            else
            {
                scheme = "http";
                path = url;
            }

            const auto fragmentPosition = path.find('#');

            // remove the fragment part
            if (fragmentPosition != std::string::npos)
                path.resize(fragmentPosition);

            const auto pathPosition = path.find('/');

            if (pathPosition == std::string::npos)
            {
                domain = path;
                path = "/";
            }
            else
            {
                domain = path.substr(0, pathPosition);
                path = path.substr(pathPosition);
            }

            const auto portPosition = domain.find(':');

            if (portPosition != std::string::npos)
            {
                port = domain.substr(portPosition + 1);
                domain.resize(portPosition);
            }
            else
                port = "80";
        }